

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

void __thiscall
btConvexHullInternal::Rational64::Rational64(Rational64 *this,int64_t numerator,int64_t denominator)

{
  int64_t denominator_local;
  int64_t numerator_local;
  Rational64 *this_local;
  
  if (numerator < 1) {
    if (numerator < 0) {
      this->sign = -1;
      this->m_numerator = -numerator;
    }
    else {
      this->sign = 0;
      this->m_numerator = 0;
    }
  }
  else {
    this->sign = 1;
    this->m_numerator = numerator;
  }
  if (denominator < 1) {
    if (denominator < 0) {
      this->sign = -this->sign;
      this->m_denominator = -denominator;
    }
    else {
      this->m_denominator = 0;
    }
  }
  else {
    this->m_denominator = denominator;
  }
  return;
}

Assistant:

Rational64(int64_t numerator, int64_t denominator)
				{
					if (numerator > 0)
					{
						sign = 1;
						m_numerator = (uint64_t) numerator;
					}
					else if (numerator < 0)
					{
						sign = -1;
						m_numerator = (uint64_t) -numerator;
					}
					else
					{
						sign = 0;
						m_numerator = 0;
					}
					if (denominator > 0)
					{
						m_denominator = (uint64_t) denominator;
					}
					else if (denominator < 0)
					{
						sign = -sign;
						m_denominator = (uint64_t) -denominator;
					}
					else
					{
						m_denominator = 0;
					}
				}